

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O1

void __thiscall iu_ProdTest_x_iutest_x_Peep_Test::Body(iu_ProdTest_x_iutest_x_Peep_Test *this)

{
  int *in_R9;
  ProdClass c;
  AssertionResult iutest_ar;
  allocator<char> local_1ed;
  int local_1ec;
  AssertionResult local_1e8;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  local_1ec = 100;
  local_190._0_4_ = 100;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1e8,(internal *)0x1fcdda,
             "(c.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass> >::value)",local_190,
             (int *)((long)&local_1ec + iutest::detail::peep_tag<iu_peep_tag_m_x<ProdClass>>::value)
             ,in_R9);
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_1ed);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x9f;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ProdTest, Peep)
{
    ProdClass c;
    IUTEST_ASSERT_EQ(100, IUTEST_PEEP_GET(c, ProdClass, m_x));
}